

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O2

SmallBuffer * __thiscall helics::SmallBuffer::operator=(SmallBuffer *this,SmallBuffer *sb)

{
  byte *pbVar1;
  SmallBuffer *pSVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  
  if (this->locked == true) {
    pSVar2 = operator=(this,sb);
    return pSVar2;
  }
  if (this->usingAllocatedBuffer == true) {
    pbVar1 = this->heap;
    if (this->nonOwning == true) {
      if (sb->heap == pbVar1) {
        sVar3 = sb->bufferCapacity;
        this->bufferSize = sb->bufferSize;
        this->bufferCapacity = sVar3;
        return this;
      }
    }
    else {
      if (sb->heap == pbVar1) {
        this->bufferSize = sb->bufferSize;
        return this;
      }
      if (pbVar1 != (byte *)0x0) {
        operator_delete__(pbVar1);
      }
    }
  }
  bVar5 = sb->usingAllocatedBuffer != true;
  if (bVar5) {
    memcpy(this,(SmallBuffer *)sb->heap,sb->bufferSize);
    sVar3 = 0x40;
    bVar4 = false;
    pSVar2 = this;
  }
  else {
    sVar3 = sb->bufferCapacity;
    bVar4 = sb->nonOwning;
    pSVar2 = (SmallBuffer *)sb->heap;
  }
  this->heap = (byte *)pSVar2;
  this->bufferCapacity = sVar3;
  this->usingAllocatedBuffer = !bVar5;
  this->nonOwning = bVar4;
  this->locked = sb->locked;
  this->bufferSize = sb->bufferSize;
  sb->heap = (byte *)sb;
  sb->bufferCapacity = 0x40;
  sb->bufferSize = 0;
  sb->locked = false;
  sb->usingAllocatedBuffer = false;
  return this;
}

Assistant:

SmallBuffer& operator=(SmallBuffer&& sb) noexcept
    {
        if (locked) {
            // if locked then use the copy operation not move
            const SmallBuffer& buf = sb;
            try {
                return operator=(buf);
            }
            catch (std::bad_alloc&) {
                errorCondition = 2;
                return *this;
            }
        }
        if (usingAllocatedBuffer) {
            if (nonOwning) {
                if (sb.heap == heap) {
                    bufferSize = sb.bufferSize;
                    bufferCapacity = sb.bufferCapacity;
                    return *this;
                }
            } else {
                if (sb.heap == heap) {
                    bufferSize = sb.bufferSize;
                    return *this;
                }
                delete[] heap;
            }
        }

        if (sb.usingAllocatedBuffer) {
            heap = sb.heap;
            bufferCapacity = sb.bufferCapacity;
            usingAllocatedBuffer = true;
            nonOwning = sb.nonOwning;
        } else {
            std::memcpy(buffer.data(), sb.heap, sb.bufferSize);
            usingAllocatedBuffer = false;
            nonOwning = false;
            heap = buffer.data();
            bufferCapacity = 64;
        }
        locked = sb.locked;
        bufferSize = sb.bufferSize;
        sb.heap = sb.buffer.data();
        sb.bufferCapacity = 64;
        sb.bufferSize = 0;
        sb.usingAllocatedBuffer = false;
        sb.locked = false;

        return *this;
    }